

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O2

_Bool test_matches_pattern(char *symbolic_name_pattern,TestItem *test_item)

{
  int iVar1;
  int iVar2;
  char *__pattern;
  char *__pattern_00;
  
  __pattern = context_name_of(symbolic_name_pattern);
  iVar1 = fnmatch(__pattern,test_item->context_name,0);
  __pattern_00 = test_name_of(symbolic_name_pattern);
  iVar2 = fnmatch(__pattern_00,test_item->test_name,0);
  free(__pattern);
  free(__pattern_00);
  return iVar2 == 0 && iVar1 == 0;
}

Assistant:

static bool test_matches_pattern(const char *symbolic_name_pattern,
                                 TestItem *test_item) {
    char* context_name = context_name_of(symbolic_name_pattern);
    int context_name_matches_test = fnmatch(context_name, test_item->context_name, 0) == 0;
    char* test_name = test_name_of(symbolic_name_pattern);
    int test_name_matches_test = fnmatch(test_name, test_item->test_name, 0) == 0;

    free(context_name);
    free(test_name);

    return context_name_matches_test && test_name_matches_test;
}